

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenCard.cpp
# Opt level: O2

int __thiscall GreenCard::addBonus(GreenCard *this,int money,int honour)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  Item *temp;
  string ans;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (this->type == FOLLOWER) {
    iVar2 = Follower::getEffectCost((Follower *)this);
    if (money < iVar2) {
      pcVar5 = "Not enough money";
    }
    else {
      iVar2 = Follower::getMinimumHonor((Follower *)this);
      if (iVar2 <= honour) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Do you want to upgrade your card ");
        poVar4 = std::operator<<(poVar4,(string *)&this->name);
        poVar4 = std::operator<<(poVar4,"?");
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"Cost: ");
        iVar2 = Follower::getEffectCost((Follower *)this);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"Bonus: ");
        iVar2 = Follower::getEffectBonus((Follower *)this);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&std::cout,"Enter y for yes, n for no");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        local_48._M_string_length = 0;
        local_48.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&std::cin,(string *)&local_48);
        bVar1 = std::operator!=(&local_48,"n");
        if (!bVar1) {
          iVar2 = Follower::getAttackBonus((Follower *)this);
          iVar3 = Follower::getEffectCost((Follower *)this);
          Follower::setAttackBonus((Follower *)this,iVar3 + iVar2);
          iVar2 = Follower::getDefenseBonus((Follower *)this);
          iVar3 = Follower::getEffectBonus((Follower *)this);
          Follower::setDefenseBonus((Follower *)this,iVar3 + iVar2);
          iVar2 = Follower::getEffectCost((Follower *)this);
          goto LAB_001090b5;
        }
        goto LAB_001090b7;
      }
      pcVar5 = "Not honourable enough";
    }
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    if (money < this->cost) {
      return money;
    }
    if (honour < this->minimumHonor) {
      return money;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Do you want to upgrade your card ");
    poVar4 = std::operator<<(poVar4,(string *)&this->name);
    poVar4 = std::operator<<(poVar4,"?");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"Cost: ");
    iVar2 = Item::getEffectCost((Item *)this);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<(poVar4,"Bonus: ");
    iVar2 = Item::getEffectBonus((Item *)this);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"Enter y for yes, n for no");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&std::cin,(string *)&local_48);
    bVar1 = std::operator!=(&local_48,"n");
    if (!bVar1) {
      iVar2 = Item::getAttackBonus((Item *)this);
      iVar3 = Item::getEffectCost((Item *)this);
      Item::setAttackBonus((Item *)this,iVar3 + iVar2);
      iVar2 = Item::getDefenseBonus((Item *)this);
      iVar3 = Item::getEffectBonus((Item *)this);
      Item::setDefenseBonus((Item *)this,iVar3 + iVar2);
      iVar2 = Item::getEffectCost((Item *)this);
LAB_001090b5:
      money = money - iVar2;
    }
LAB_001090b7:
    std::__cxx11::string::~string((string *)&local_48);
  }
  return money;
}

Assistant:

int GreenCard::addBonus(int money, int honour)       //if bought adds bonuses and returns new amount of money of player, else returns same amount
{                                                    //casts to follower or item to have access to cards' data
    if (type == FOLLOWER)
    {
        Follower *temp = reinterpret_cast<Follower*>(this);

        if (money < temp->getEffectCost())
        {
            cout << "Not enough money"<<endl;
            return money;
        }
        if (honour < temp->getMinimumHonor())
        {
            cout << "Not honourable enough"<<endl;
            return money;
        }

        cout << "Do you want to upgrade your card "<< name <<"?" << endl;
        cout << "Cost: "<< temp->getEffectCost() <<endl << "Bonus: "<< temp->getEffectBonus()<<endl;
        cout <<"Enter y for yes, n for no"<< endl;
        string ans;
        cin >> ans;

        if (ans != "n")
            return money;

        //add bonuses to card stats
        temp->setAttackBonus(temp->getAttackBonus() + temp->getEffectCost());
        temp->setDefenseBonus(temp->getDefenseBonus() + temp->getEffectBonus());

        return money-temp->getEffectCost();
    }
    else
    {
        Item *temp = reinterpret_cast<Item*>(this);

        if (money < cost || honour < minimumHonor)
            return money;

        cout << "Do you want to upgrade your card "<< name <<"?" << endl;
        cout << "Cost: "<< temp->getEffectCost() <<endl << "Bonus: "<< temp->getEffectBonus()<<endl;
        cout <<"Enter y for yes, n for no"<< endl;
        string ans;
        cin >> ans;

        if (ans != "n")
            return money;

        //add bonuses to card stats
        temp->setAttackBonus(temp->getAttackBonus() + temp->getEffectCost());
        temp->setDefenseBonus(temp->getDefenseBonus() + temp->getEffectBonus());

        return money-temp->getEffectCost();
    }
}